

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O0

void __thiscall ThreadPool::start(ThreadPool *this,shared_ptr<ThreadPool::Job> *job,int priority)

{
  bool bVar1;
  element_type *peVar2;
  ThreadPoolThread *this_00;
  size_type sVar3;
  __shared_ptr_access<ThreadPool::Job,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var4;
  iterator local_80;
  iterator local_60;
  lock_guard<std::mutex> local_40;
  lock_guard<std::mutex> lock;
  ThreadPoolThread *t;
  int priority_local;
  shared_ptr<ThreadPool::Job> *job_local;
  ThreadPool *this_local;
  
  peVar2 = std::__shared_ptr_access<ThreadPool::Job,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ThreadPool::Job,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)job);
  peVar2->mPriority = priority;
  if (priority == -1) {
    this_00 = (ThreadPoolThread *)operator_new(0x78);
    ThreadPoolThread::ThreadPoolThread(this_00,job);
    Thread::start((Thread *)this_00,this->mPriority,this->mThreadStackSize);
  }
  else {
    std::lock_guard<std::mutex>::lock_guard(&local_40,&this->mMutex);
    bVar1 = std::
            deque<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
            ::empty(&this->mJobs);
    if (bVar1) {
      std::
      deque<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>::
      push_back(&this->mJobs,job);
    }
    else {
      sVar3 = std::
              deque<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
              ::size(&this->mJobs);
      p_Var4 = (__shared_ptr_access<ThreadPool::Job,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               std::
               deque<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
               ::at(&this->mJobs,sVar3 - 1);
      peVar2 = std::__shared_ptr_access<ThreadPool::Job,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(p_Var4);
      if (peVar2->mPriority < priority) {
        p_Var4 = (__shared_ptr_access<ThreadPool::Job,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 std::
                 deque<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
                 ::at(&this->mJobs,0);
        peVar2 = std::__shared_ptr_access<ThreadPool::Job,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(p_Var4);
        if (peVar2->mPriority < priority) {
          std::
          deque<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
          ::push_front(&this->mJobs,job);
        }
        else {
          std::
          deque<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
          ::push_back(&this->mJobs,job);
          std::
          deque<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
          ::begin(&local_60,&this->mJobs);
          std::
          deque<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
          ::end(&local_80,&this->mJobs);
          std::
          sort<std::_Deque_iterator<std::shared_ptr<ThreadPool::Job>,std::shared_ptr<ThreadPool::Job>&,std::shared_ptr<ThreadPool::Job>*>,bool(*)(std::shared_ptr<ThreadPool::Job>const&,std::shared_ptr<ThreadPool::Job>const&)>
                    (&local_60,&local_80,jobLessThan);
        }
      }
      else {
        std::
        deque<std::shared_ptr<ThreadPool::Job>,_std::allocator<std::shared_ptr<ThreadPool::Job>_>_>
        ::push_back(&this->mJobs,job);
      }
    }
    std::condition_variable::notify_one();
    std::lock_guard<std::mutex>::~lock_guard(&local_40);
  }
  return;
}

Assistant:

void ThreadPool::start(const std::shared_ptr<Job> &job, int priority)
{
    job->mPriority = priority;
    if (priority == Guaranteed) {
        ThreadPoolThread *t = new ThreadPoolThread(job);
        t->start(mPriority, mThreadStackSize);
        return;
    }

    std::lock_guard<std::mutex> lock(mMutex);
    if (mJobs.empty()) {
        mJobs.push_back(job);
    } else {
        if (mJobs.at(mJobs.size() - 1)->mPriority >= priority) {
            mJobs.push_back(job);
        } else if (mJobs.at(0)->mPriority < priority) {
            mJobs.push_front(job);
        } else {
            mJobs.push_back(job);
            std::sort(mJobs.begin(), mJobs.end(), jobLessThan);
        }
    }
    mCond.notify_one();
}